

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O0

int write_sparse_data_chunk(output_file *out,uint len,void *data)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  void *in_RDX;
  uint in_ESI;
  long *in_RDI;
  int ret;
  int zero_len;
  int rnd_up_len;
  chunk_header_t chunk_header;
  undefined2 local_2c;
  undefined2 local_2a;
  uint local_28;
  int local_24;
  void *local_20;
  uint local_14;
  long *local_10;
  int local_4;
  
  uVar1 = *(int *)((long)in_RDI + 0x24) *
          (((in_ESI + *(int *)((long)in_RDI + 0x24)) - 1) / *(uint *)((long)in_RDI + 0x24));
  iVar2 = uVar1 - in_ESI;
  local_2c = 0xcac1;
  local_2a = 0;
  local_28 = uVar1 / *(uint *)((long)in_RDI + 0x24);
  local_24 = uVar1 + 0xc;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  iVar3 = (**(code **)(in_RDI[2] + 0x18))(in_RDI,&local_2c,0xc);
  if (iVar3 < 0) {
    local_4 = -1;
  }
  else {
    iVar3 = (**(code **)(local_10[2] + 0x18))(local_10,local_20,local_14);
    if (iVar3 < 0) {
      local_4 = -1;
    }
    else if ((iVar2 == 0) ||
            (iVar3 = (**(code **)(local_10[2] + 0x18))(local_10,local_10[6],(long)iVar2), -1 < iVar3
            )) {
      if ((int)local_10[4] != 0) {
        uVar4 = sparse_crc32(*(uint32_t *)((long)local_10 + 0xc),local_20,(ulong)local_14);
        *(uint32_t *)((long)local_10 + 0xc) = uVar4;
        if (iVar2 != 0) {
          uVar4 = sparse_crc32(*(uint32_t *)((long)local_10 + 0xc),(void *)local_10[6],(long)iVar2);
          *(uint32_t *)((long)local_10 + 0xc) = uVar4;
        }
      }
      *local_10 = (long)(int)uVar1 + *local_10;
      *(int *)(local_10 + 1) = (int)local_10[1] + 1;
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int write_sparse_data_chunk(struct output_file* out, unsigned int len, void* data) {
  chunk_header_t chunk_header;
  int rnd_up_len, zero_len;
  int ret;

  /* Round up the data length to a multiple of the block size */
  rnd_up_len = ALIGN(len, out->block_size);
  zero_len = rnd_up_len - len;

  /* Finally we can safely emit a chunk of data */
  chunk_header.chunk_type = CHUNK_TYPE_RAW;
  chunk_header.reserved1 = 0;
  chunk_header.chunk_sz = rnd_up_len / out->block_size;
  chunk_header.total_sz = CHUNK_HEADER_LEN + rnd_up_len;
  ret = out->ops->write(out, &chunk_header, sizeof(chunk_header));

  if (ret < 0) return -1;
  ret = out->ops->write(out, data, len);
  if (ret < 0) return -1;
  if (zero_len) {
    ret = out->ops->write(out, out->zero_buf, zero_len);
    if (ret < 0) return -1;
  }

  if (out->use_crc) {
    out->crc32 = sparse_crc32(out->crc32, data, len);
    if (zero_len) out->crc32 = sparse_crc32(out->crc32, out->zero_buf, zero_len);
  }

  out->cur_out_ptr += rnd_up_len;
  out->chunk_cnt++;

  return 0;
}